

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractmodelserialiser.cpp
# Opt level: O0

QList<int> * AbstractModelSerialiser::modelDefaultRoles(void)

{
  initializer_list<int> args;
  QList<int> *in_RDI;
  int local_5c [15];
  iterator local_20;
  undefined8 local_18;
  
  memcpy(local_5c,&DAT_001a17c8,0x3c);
  local_20 = local_5c;
  local_18 = 0xf;
  args._M_len = 0xf;
  args._M_array = local_20;
  QList<int>::QList(in_RDI,args);
  return in_RDI;
}

Assistant:

QList<int> AbstractModelSerialiser::modelDefaultRoles()
{
    return QList<int>{Qt::EditRole,
                      Qt::DecorationRole,
                      Qt::ToolTipRole,
                      Qt::StatusTipRole,
                      Qt::WhatsThisRole,
                      Qt::SizeHintRole,
                      Qt::FontRole,
                      Qt::TextAlignmentRole,
                      Qt::BackgroundRole,
                      Qt::ForegroundRole,
                      Qt::CheckStateRole,
                      Qt::InitialSortOrderRole,
                      Qt::AccessibleTextRole,
                      Qt::AccessibleDescriptionRole,
                      Qt::UserRole};
}